

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O0

bool handle_command_args(int argc,char **argv,Arguments *args)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  unsigned_long *puVar3;
  char *pcVar4;
  string *local_be8;
  ArgException *e;
  string local_b58 [39];
  allocator local_b31;
  string local_b30 [39];
  allocator local_b09;
  string local_b08 [39];
  allocator local_ae1;
  string local_ae0 [32];
  undefined1 local_ac0 [8];
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  fileArg;
  string local_9a8 [39];
  allocator local_981;
  string local_980 [39];
  allocator local_959;
  string local_958 [39];
  allocator local_931;
  string local_930 [32];
  undefined1 local_910 [8];
  ValueArg<unsigned_long> limitArg;
  string local_828 [39];
  allocator local_801;
  string local_800 [39];
  allocator local_7d9;
  string local_7d8 [32];
  undefined1 local_7b8 [8];
  SwitchArg verboseArg;
  string local_708 [39];
  allocator local_6e1;
  string local_6e0 [39];
  allocator local_6b9;
  string local_6b8 [39];
  allocator local_691;
  string local_690 [39];
  allocator local_669;
  string local_668 [32];
  undefined1 local_648 [8];
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  codepageArg;
  string local_530 [39];
  allocator local_509;
  string local_508 [39];
  allocator local_4e1;
  string local_4e0 [39];
  allocator local_4b9;
  string local_4b8 [32];
  undefined1 local_498 [8];
  ValueArg<char> separatorArg;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [32];
  undefined1 local_328 [8];
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> typeArg
  ;
  ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  allowedVals;
  string local_1c8 [32];
  string local_1a8 [32];
  iterator local_188;
  size_type local_180;
  undefined1 local_178 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowed;
  string local_158 [55];
  allocator local_121;
  string local_120 [32];
  undefined1 local_100 [8];
  CmdLine cmd;
  Arguments *args_local;
  char **argv_local;
  int argc_local;
  
  cmd._216_8_ = args;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_120,"Convert a TSV or CSV file to a \'clean\' UTF-8 encoded TSV output",
             &local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_158,"0.1",
             (allocator *)
             ((long)&allowed.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  TCLAP::CmdLine::CmdLine((CmdLine *)local_100,(string *)local_120,' ',(string *)local_158,true);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&allowed.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  allowedVals._61_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"csv",(allocator *)&allowedVals.field_0x3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"tsv",(allocator *)&allowedVals.field_0x3e);
  allowedVals._61_1_ = 0;
  local_188 = (iterator)local_1c8;
  local_180 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&allowedVals.field_0x3c);
  __l._M_len = local_180;
  __l._M_array = local_188;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_178,__l,(allocator_type *)&allowedVals.field_0x3c);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&allowedVals.field_0x3c);
  local_be8 = (string *)&local_188;
  do {
    local_be8 = local_be8 + -0x20;
    std::__cxx11::string::~string(local_be8);
  } while (local_be8 != local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&allowedVals.field_0x3e);
  std::allocator<char>::~allocator((allocator<char> *)&allowedVals.field_0x3f);
  TCLAP::
  ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValuesConstraint((ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&typeArg._constraint,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"t",&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"type",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"The type of input file",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"csv",(allocator *)((long)&separatorArg._constraint + 7));
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_328,(string *)local_348,(string *)local_370,(string *)local_398,false,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0,
             (Constraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&typeArg._constraint,(Visitor *)0x0);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&separatorArg._constraint + 7));
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  TCLAP::CmdLine::add((CmdLine *)local_100,(Arg *)local_328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b8,"s",&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e0,"separator",&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_508,"Separator character to use when decoding",&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_530,"separator character",(allocator *)((long)&codepageArg._constraint + 7));
  TCLAP::ValueArg<char>::ValueArg
            ((ValueArg<char> *)local_498,(string *)local_4b8,(string *)local_4e0,(string *)local_508
             ,false,',',(string *)local_530,(Visitor *)0x0);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator((allocator<char> *)((long)&codepageArg._constraint + 7));
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  TCLAP::CmdLine::add((CmdLine *)local_100,(Arg *)local_498);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_668,"c",&local_669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_690,"codepage",&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6b8,"The codepage to decode the input file if automatic detection doesn\'t work",
             &local_6b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e0,"",&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_708,"codepage",(allocator *)&verboseArg.super_Arg.field_0xa7);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_648,(string *)local_668,(string *)local_690,(string *)local_6b8,false,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e0,
             (string *)local_708,(Visitor *)0x0);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator((allocator<char> *)&verboseArg.super_Arg.field_0xa7);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  std::__cxx11::string::~string(local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  std::__cxx11::string::~string(local_668);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  TCLAP::CmdLine::add((CmdLine *)local_100,(Arg *)local_648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7d8,"v",&local_7d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_800,"verbose",&local_801);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_828,"Display a progress bar during parsing",
             (allocator *)((long)&limitArg._constraint + 7));
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_7b8,(string *)local_7d8,(string *)local_800,(string *)local_828,
             false,(Visitor *)0x0);
  std::__cxx11::string::~string(local_828);
  std::allocator<char>::~allocator((allocator<char> *)((long)&limitArg._constraint + 7));
  std::__cxx11::string::~string(local_800);
  std::allocator<char>::~allocator((allocator<char> *)&local_801);
  std::__cxx11::string::~string(local_7d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
  TCLAP::CmdLine::add((CmdLine *)local_100,(Arg *)local_7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_930,"l",&local_931);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_958,"limit",&local_959);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_980,"limit to the first <limit> records",&local_981);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_9a8,"limit",
             (allocator *)
             ((long)&fileArg.
                     super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._constraint + 7));
  TCLAP::ValueArg<unsigned_long>::ValueArg
            ((ValueArg<unsigned_long> *)local_910,(string *)local_930,(string *)local_958,
             (string *)local_980,false,0,(string *)local_9a8,(Visitor *)0x0);
  std::__cxx11::string::~string(local_9a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fileArg.
                     super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._constraint + 7));
  std::__cxx11::string::~string(local_980);
  std::allocator<char>::~allocator((allocator<char> *)&local_981);
  std::__cxx11::string::~string(local_958);
  std::allocator<char>::~allocator((allocator<char> *)&local_959);
  std::__cxx11::string::~string(local_930);
  std::allocator<char>::~allocator((allocator<char> *)&local_931);
  TCLAP::CmdLine::add((CmdLine *)local_100,(Arg *)local_910);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ae0,"file",&local_ae1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b08,"input file",&local_b09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b30,"filenameString",&local_b31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b58,"value",(allocator *)((long)&e + 7));
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::UnlabeledValueArg((UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_ac0,(string *)local_ae0,(string *)local_b08,true,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b30
                      ,(string *)local_b58,false,(Visitor *)0x0);
  std::__cxx11::string::~string(local_b58);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string(local_b30);
  std::allocator<char>::~allocator((allocator<char> *)&local_b31);
  std::__cxx11::string::~string(local_b08);
  std::allocator<char>::~allocator((allocator<char> *)&local_b09);
  std::__cxx11::string::~string(local_ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
  TCLAP::CmdLine::add((CmdLine *)local_100,(Arg *)local_ac0);
  TCLAP::CmdLine::parse((CmdLine *)local_100,argc,argv);
  pbVar2 = TCLAP::
           ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_328);
  std::__cxx11::string::operator=((string *)cmd._216_8_,(string *)pbVar2);
  bVar1 = TCLAP::SwitchArg::getValue((SwitchArg *)local_7b8);
  *(bool *)(cmd._216_8_ + 0x21) = bVar1;
  pbVar2 = TCLAP::
           ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_ac0);
  std::__cxx11::string::operator=((string *)(cmd._216_8_ + 0x28),(string *)pbVar2);
  puVar3 = TCLAP::ValueArg<unsigned_long>::getValue((ValueArg<unsigned_long> *)local_910);
  *(unsigned_long *)(cmd._216_8_ + 0x68) = *puVar3;
  pbVar2 = TCLAP::
           ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_648);
  std::__cxx11::string::operator=((string *)(cmd._216_8_ + 0x48),(string *)pbVar2);
  pcVar4 = TCLAP::ValueArg<char>::getValue((ValueArg<char> *)local_498);
  *(char *)(cmd._216_8_ + 0x20) = *pcVar4;
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~UnlabeledValueArg
            ((UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_ac0);
  TCLAP::ValueArg<unsigned_long>::~ValueArg((ValueArg<unsigned_long> *)local_910);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_7b8);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_648);
  TCLAP::ValueArg<char>::~ValueArg((ValueArg<char> *)local_498);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_328);
  TCLAP::
  ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValuesConstraint((ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&typeArg._constraint);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_178);
  TCLAP::CmdLine::~CmdLine((CmdLine *)local_100);
  return true;
}

Assistant:

bool handle_command_args(int argc, const char * const * argv, Arguments& args) {
	try {
		TCLAP::CmdLine cmd("Convert a TSV or CSV file to a 'clean' UTF-8 encoded TSV output", ' ', "0.1");
		
		std::vector<std::string> allowed { "csv", "tsv" };
		TCLAP::ValuesConstraint<std::string> allowedVals( allowed );
		TCLAP::ValueArg<std::string> typeArg("t", "type", "The type of input file", false, "csv", &allowedVals);
		cmd.add( typeArg );

		TCLAP::ValueArg<char> separatorArg("s", "separator", "Separator character to use when decoding", false, ',', "separator character");
		cmd.add( separatorArg );

		TCLAP::ValueArg<std::string> codepageArg("c", "codepage", "The codepage to decode the input file if automatic detection doesn't work", false, "", "codepage");
		cmd.add( codepageArg );

		TCLAP::SwitchArg verboseArg("v", "verbose", "Display a progress bar during parsing");
		cmd.add( verboseArg );
		TCLAP::ValueArg<size_t> limitArg("l", "limit", "limit to the first <limit> records", false, 0, "limit");
		cmd.add( limitArg );
		TCLAP::UnlabeledValueArg<std::string> fileArg("file", "input file", true, "filenameString", "value");
		cmd.add( fileArg );
		
		// Parse the argv array.
		cmd.parse( argc, argv );
		
		args.type = typeArg.getValue();
		args.verbose = verboseArg.getValue();
		args.inputFile = fileArg.getValue();
		args.limit = limitArg.getValue();
		args.codepage = codepageArg.getValue();
		args.separator = separatorArg.getValue();
	}
	catch (TCLAP::ArgException &e) {
		std::cerr << "error: " << e.error() << " for arg " << e.argId() << std::endl;
		return false;
	}
	return true;
}